

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm_suite.cpp
# Opt level: O2

void lower_bound_sorted_suite::run(void)

{
  find_even_first();
  find_even_first_predicate();
  find_even_last();
  find_even_last_predicate();
  find_odd_first();
  find_odd_first_predicate();
  find_odd_last();
  find_odd_last_predicate();
  return;
}

Assistant:

void run()
{
    find_even_first();
    find_even_first_predicate();
    find_even_last();
    find_even_last_predicate();
    find_odd_first();
    find_odd_first_predicate();
    find_odd_last();
    find_odd_last_predicate();
}